

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

int glad_gl_find_core_gl(void)

{
  int iVar1;
  size_t __n;
  bool local_64;
  bool local_63;
  bool local_62;
  bool local_61;
  bool local_60;
  bool local_5f;
  bool local_5e;
  bool local_5d;
  bool local_5c;
  bool local_5b;
  bool local_5a;
  bool local_59;
  size_t length;
  int minor;
  int major;
  char *prefixes [5];
  GLubyte *local_18;
  char *version;
  int i;
  
  memcpy(&minor,&PTR_anon_var_dwarf_6745_001570c0,0x28);
  length._4_4_ = 0;
  length._0_4_ = 0;
  local_18 = (*glad_glGetString)(0x1f02);
  if (local_18 == (GLubyte *)0x0) {
    version._4_4_ = 0;
  }
  else {
    version._0_4_ = 0;
    while (*(long *)(&minor + (long)(int)version * 2) != 0) {
      __n = strlen(*(char **)(&minor + (long)(int)version * 2));
      iVar1 = strncmp((char *)local_18,*(char **)(&minor + (long)(int)version * 2),__n);
      if (iVar1 == 0) {
        local_18 = local_18 + __n;
        break;
      }
      version._0_4_ = (int)version + 1;
    }
    __isoc99_sscanf(local_18,"%d.%d",(long)&length + 4,&length);
    if ((length._4_4_ != 1) || (local_59 = true, (int)length < 0)) {
      local_59 = 1 < length._4_4_;
    }
    GLAD_GL_VERSION_1_0 = (int)local_59;
    if ((length._4_4_ != 1) || (local_5a = true, (int)length < 1)) {
      local_5a = 1 < length._4_4_;
    }
    GLAD_GL_VERSION_1_1 = (int)local_5a;
    if ((length._4_4_ != 1) || (local_5b = true, (int)length < 2)) {
      local_5b = 1 < length._4_4_;
    }
    GLAD_GL_VERSION_1_2 = (int)local_5b;
    if ((length._4_4_ != 1) || (local_5c = true, (int)length < 3)) {
      local_5c = 1 < length._4_4_;
    }
    GLAD_GL_VERSION_1_3 = (int)local_5c;
    if ((length._4_4_ != 1) || (local_5d = true, (int)length < 4)) {
      local_5d = 1 < length._4_4_;
    }
    GLAD_GL_VERSION_1_4 = (int)local_5d;
    if ((length._4_4_ != 1) || (local_5e = true, (int)length < 5)) {
      local_5e = 1 < length._4_4_;
    }
    GLAD_GL_VERSION_1_5 = (int)local_5e;
    if ((length._4_4_ != 2) || (local_5f = true, (int)length < 0)) {
      local_5f = 2 < length._4_4_;
    }
    GLAD_GL_VERSION_2_0 = (int)local_5f;
    if ((length._4_4_ != 2) || (local_60 = true, (int)length < 1)) {
      local_60 = 2 < length._4_4_;
    }
    GLAD_GL_VERSION_2_1 = (int)local_60;
    if ((length._4_4_ != 3) || (local_61 = true, (int)length < 0)) {
      local_61 = 3 < length._4_4_;
    }
    GLAD_GL_VERSION_3_0 = (int)local_61;
    if ((length._4_4_ != 3) || (local_62 = true, (int)length < 1)) {
      local_62 = 3 < length._4_4_;
    }
    GLAD_GL_VERSION_3_1 = (int)local_62;
    if ((length._4_4_ != 3) || (local_63 = true, (int)length < 2)) {
      local_63 = 3 < length._4_4_;
    }
    GLAD_GL_VERSION_3_2 = (int)local_63;
    if ((length._4_4_ != 3) || (local_64 = true, (int)length < 3)) {
      local_64 = 3 < length._4_4_;
    }
    GLAD_GL_VERSION_3_3 = (int)local_64;
    version._4_4_ = length._4_4_ * 10000 + (int)length;
  }
  return version._4_4_;
}

Assistant:

static int glad_gl_find_core_gl(void) {
    int i;
    const char* version;
    const char* prefixes[] = {
        "OpenGL ES-CM ",
        "OpenGL ES-CL ",
        "OpenGL ES ",
        "OpenGL SC ",
        NULL
    };
    int major = 0;
    int minor = 0;
    version = (const char*) glad_glGetString(GL_VERSION);
    if (!version) return 0;
    for (i = 0;  prefixes[i];  i++) {
        const size_t length = strlen(prefixes[i]);
        if (strncmp(version, prefixes[i], length) == 0) {
            version += length;
            break;
        }
    }

    GLAD_IMPL_UTIL_SSCANF(version, "%d.%d", &major, &minor);

    GLAD_GL_VERSION_1_0 = (major == 1 && minor >= 0) || major > 1;
    GLAD_GL_VERSION_1_1 = (major == 1 && minor >= 1) || major > 1;
    GLAD_GL_VERSION_1_2 = (major == 1 && minor >= 2) || major > 1;
    GLAD_GL_VERSION_1_3 = (major == 1 && minor >= 3) || major > 1;
    GLAD_GL_VERSION_1_4 = (major == 1 && minor >= 4) || major > 1;
    GLAD_GL_VERSION_1_5 = (major == 1 && minor >= 5) || major > 1;
    GLAD_GL_VERSION_2_0 = (major == 2 && minor >= 0) || major > 2;
    GLAD_GL_VERSION_2_1 = (major == 2 && minor >= 1) || major > 2;
    GLAD_GL_VERSION_3_0 = (major == 3 && minor >= 0) || major > 3;
    GLAD_GL_VERSION_3_1 = (major == 3 && minor >= 1) || major > 3;
    GLAD_GL_VERSION_3_2 = (major == 3 && minor >= 2) || major > 3;
    GLAD_GL_VERSION_3_3 = (major == 3 && minor >= 3) || major > 3;

    return GLAD_MAKE_VERSION(major, minor);
}